

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

Value * duckdb::Vector::GetValueInternal(Vector *v_p,idx_t index_p)

{
  interval_t interval;
  hugeint_t value_00;
  uhugeint_t value_01;
  hugeint_t value_02;
  hugeint_t value_03;
  bool bVar1;
  VectorType VVar2;
  PhysicalType PVar3;
  LogicalTypeId LVar4;
  LogicalType *pLVar5;
  undefined8 uVar6;
  char *pcVar7;
  const_data_ptr_t pdVar8;
  size_type sVar9;
  string *msg;
  idx_t in_RDX;
  Vector *in_RSI;
  Value *in_RDI;
  idx_t i_2;
  vector<duckdb::Value,_true> children_3;
  Vector *child_vec_2;
  idx_t offset;
  idx_t stride;
  idx_t i_1;
  vector<duckdb::Value,_true> children_2;
  Vector *child_vec_1;
  list_entry_t offlen_1;
  value_type *struct_child;
  idx_t child_idx;
  child_list_t<Value> children_1;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *child_entries;
  child_list_t<LogicalType> members;
  Value value;
  union_tag_t tag;
  idx_t i;
  vector<duckdb::Value,_true> children;
  Vector *child_vec;
  list_entry_t offlen;
  string_t str_4;
  string_t str_3;
  string_t str_2;
  string_t str_1;
  string_t str;
  uint8_t scale;
  uint8_t width;
  string string_val;
  vector<unsigned_char,_true> *decompress_buffer;
  void *decoder;
  string_t str_compressed;
  LogicalType *type;
  ValidityMask *validity;
  data_ptr_t data;
  int64_t increment;
  int64_t start;
  Vector *child;
  SelectionVector *sel_vector;
  bool finished;
  idx_t index;
  Vector *vector;
  value_type *in_stack_fffffffffffff7f8;
  Vector *in_stack_fffffffffffff800;
  allocator *paVar10;
  Vector *in_stack_fffffffffffff808;
  Vector *in_stack_fffffffffffff810;
  union_tag_t *in_stack_fffffffffffff818;
  idx_t in_stack_fffffffffffff820;
  Vector *in_stack_fffffffffffff828;
  dtime_tz_t in_stack_fffffffffffff838;
  date_t value_04;
  undefined2 uVar11;
  Vector *in_stack_fffffffffffff840;
  uint64_t in_stack_fffffffffffff848;
  ulong uVar12;
  idx_t in_stack_fffffffffffff850;
  undefined4 in_stack_fffffffffffff858;
  undefined4 in_stack_fffffffffffff85c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff860;
  string *in_stack_fffffffffffff868;
  vector<unsigned_char,_true> *in_stack_fffffffffffff870;
  string *in_stack_fffffffffffff878;
  Value *in_stack_fffffffffffff880;
  void *in_stack_fffffffffffff888;
  const_data_ptr_t in_stack_fffffffffffff890;
  LogicalType *in_stack_fffffffffffff898;
  int64_t in_stack_fffffffffffff8c0;
  LogicalType *in_stack_fffffffffffff8c8;
  undefined7 in_stack_fffffffffffff8d0;
  undefined1 in_stack_fffffffffffff8d7;
  vector<duckdb::Value,_true> *in_stack_fffffffffffff8e0;
  LogicalType *in_stack_fffffffffffff8e8;
  PhysicalType type_00;
  child_list_t<Value> *in_stack_fffffffffffff908;
  Value *in_stack_fffffffffffff918;
  undefined8 in_stack_fffffffffffff920;
  uint8_t tag_00;
  child_list_t<LogicalType> *in_stack_fffffffffffff928;
  vector<duckdb::Value,_true> *in_stack_fffffffffffff940;
  LogicalType *in_stack_fffffffffffff948;
  allocator local_681;
  string local_680 [120];
  ulong local_608;
  Vector *local_5e8;
  ulong local_5e0;
  idx_t local_5d8;
  ulong local_578;
  Vector *local_558;
  ulong local_550;
  ulong local_548;
  const_reference local_488;
  ulong local_480;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  *local_460;
  ulong local_330;
  Vector *local_310;
  ulong local_308;
  ulong local_300;
  anon_union_16_2_67f50693_for_value local_2f8;
  anon_union_16_2_67f50693_for_value local_2e8;
  anon_union_16_2_67f50693_for_value local_2d8;
  anon_union_16_2_67f50693_for_value local_2c8;
  string local_2b8 [32];
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_280;
  undefined8 local_278;
  undefined1 local_26a;
  allocator local_269;
  string local_268 [39];
  undefined1 local_241;
  allocator local_219;
  string local_218 [32];
  undefined8 local_1f8;
  undefined8 local_1f0;
  uint8_t local_1e2;
  uint8_t local_1e1;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined4 local_178;
  undefined1 local_172;
  allocator local_171;
  string local_170 [36];
  undefined4 local_14c;
  string local_148 [32];
  string local_128 [32];
  vector<unsigned_char,_true> *local_108;
  void *local_100;
  anon_union_16_2_67f50693_for_value local_f8;
  undefined1 local_da;
  allocator local_d9;
  string local_d8 [56];
  LogicalType *local_a0;
  ValidityMask *local_98;
  data_ptr_t local_90;
  undefined1 local_85;
  allocator local_71;
  string local_70 [48];
  Vector *local_40;
  SelectionVector *local_38;
  byte local_29;
  idx_t local_28;
  Vector *local_20;
  uint16_t value_05;
  
  local_29 = 0;
  local_28 = in_RDX;
  local_20 = in_RSI;
  while (tag_00 = (uint8_t)((ulong)in_stack_fffffffffffff920 >> 0x38), ((local_29 ^ 0xff) & 1) != 0)
  {
    VVar2 = GetVectorType(local_20);
    switch(VVar2) {
    case FLAT_VECTOR:
      local_29 = 1;
      break;
    case FSST_VECTOR:
      local_29 = 1;
      break;
    case CONSTANT_VECTOR:
      local_28 = 0;
      local_29 = 1;
      break;
    case DICTIONARY_VECTOR:
      local_38 = DictionaryVector::SelVector((Vector *)0x3ddfa4);
      local_40 = DictionaryVector::Child((Vector *)0x3ddfb9);
      local_20 = local_40;
      local_28 = SelectionVector::get_index(local_38,local_28);
      break;
    case SEQUENCE_VECTOR:
      SequenceVector::GetSequence
                (in_stack_fffffffffffff810,(int64_t *)in_stack_fffffffffffff808,
                 (int64_t *)in_stack_fffffffffffff800);
      GetType(local_20);
      NumericCast<long,unsigned_long,void>(0x3de052);
      Value::Numeric(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
      return in_RDI;
    default:
      local_85 = 1;
      uVar6 = __cxa_allocate_exception(0x10);
      paVar10 = &local_71;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_70,"Unimplemented vector type for Vector::GetValue",paVar10);
      InternalException::InternalException
                ((InternalException *)in_stack_fffffffffffff800,(string *)in_stack_fffffffffffff7f8)
      ;
      local_85 = 0;
      __cxa_throw(uVar6,&InternalException::typeinfo,InternalException::~InternalException);
    }
  }
  local_90 = local_20->data;
  local_98 = &local_20->validity;
  local_a0 = GetType(local_20);
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffff808,
                     (idx_t)in_stack_fffffffffffff800);
  if (bVar1) {
    VVar2 = GetVectorType(local_20);
    if (VVar2 == FSST_VECTOR) {
      pLVar5 = GetType(local_20);
      PVar3 = LogicalType::InternalType(pLVar5);
      if (PVar3 != VARCHAR) {
        local_da = 1;
        uVar6 = __cxa_allocate_exception(0x10);
        paVar10 = &local_d9;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_d8,"FSST Vector with non-string datatype found!",paVar10);
        InternalException::InternalException
                  ((InternalException *)in_stack_fffffffffffff800,
                   (string *)in_stack_fffffffffffff7f8);
        local_da = 0;
        __cxa_throw(uVar6,&InternalException::typeinfo,InternalException::~InternalException);
      }
      local_f8._0_8_ = *(undefined8 *)(local_90 + local_28 * 0x10);
      local_f8.pointer.ptr = (char *)*(undefined8 *)(local_90 + local_28 * 0x10 + 8);
      local_100 = FSSTVector::GetDecoder(in_stack_fffffffffffff840);
      local_108 = FSSTVector::GetDecompressBuffer(in_stack_fffffffffffff840);
      string_t::GetData((string_t *)in_stack_fffffffffffff800);
      string_t::GetSize((string_t *)&local_f8.pointer);
      FSSTPrimitives::DecompressValue_abi_cxx11_
                (in_stack_fffffffffffff888,(char *)in_stack_fffffffffffff880,
                 (idx_t)in_stack_fffffffffffff878,in_stack_fffffffffffff870);
      pLVar5 = GetType(local_20);
      LVar4 = LogicalType::id(pLVar5);
      if (LVar4 == VARCHAR) {
        ::std::__cxx11::string::string(local_148,local_128);
        Value::Value(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
        ::std::__cxx11::string::~string(local_148);
      }
      else {
        if (LVar4 != BLOB) {
          local_172 = 1;
          uVar6 = __cxa_allocate_exception(0x10);
          paVar10 = &local_171;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_170,"Unsupported vector type for FSST vector",paVar10);
          InternalException::InternalException
                    ((InternalException *)in_stack_fffffffffffff800,
                     (string *)in_stack_fffffffffffff7f8);
          local_172 = 0;
          __cxa_throw(uVar6,&InternalException::typeinfo,InternalException::~InternalException);
        }
        Value::BLOB_RAW((string *)in_stack_fffffffffffff808);
      }
      local_14c = 1;
      ::std::__cxx11::string::~string(local_128);
    }
    else {
      pLVar5 = GetType(local_20);
      LVar4 = LogicalType::id(pLVar5);
      pLVar5 = (LogicalType *)(ulong)(byte)(LVar4 - BOOLEAN);
      bVar1 = SUB81(in_stack_fffffffffffff838.bits >> 0x38,0);
      value_05 = (uint16_t)(in_stack_fffffffffffff838.bits >> 0x30);
      value_04.days = (int32_t)(in_stack_fffffffffffff838.bits >> 0x20);
      switch(pLVar5) {
      case (LogicalType *)0x0:
        Value::BOOLEAN(bVar1);
        break;
      case (LogicalType *)0x1:
        Value::TINYINT(bVar1);
        break;
      case (LogicalType *)0x2:
        Value::SMALLINT(value_05);
        break;
      case (LogicalType *)0x3:
        Value::INTEGER(value_04.days);
        break;
      case (LogicalType *)0x4:
        Value::BIGINT(in_stack_fffffffffffff838.bits);
        break;
      case (LogicalType *)0x5:
        local_178 = *(undefined4 *)(local_90 + local_28 * 4);
        Value::DATE(value_04);
        break;
      case (LogicalType *)0x6:
        local_180 = *(undefined8 *)(local_90 + local_28 * 8);
        Value::TIME((dtime_t)in_stack_fffffffffffff838.bits);
        break;
      case (LogicalType *)0x7:
        local_1a8 = *(undefined8 *)(local_90 + local_28 * 8);
        Value::TIMESTAMPSEC((timestamp_sec_t)in_stack_fffffffffffff838.bits);
        break;
      case (LogicalType *)0x8:
        local_1a0 = *(undefined8 *)(local_90 + local_28 * 8);
        Value::TIMESTAMPMS((timestamp_ms_t)in_stack_fffffffffffff838.bits);
        break;
      case (LogicalType *)0x9:
        local_190 = *(undefined8 *)(local_90 + local_28 * 8);
        Value::TIMESTAMP((timestamp_t)in_stack_fffffffffffff838.bits);
        break;
      case (LogicalType *)0xa:
        local_198 = *(undefined8 *)(local_90 + local_28 * 8);
        Value::TIMESTAMPNS((timestamp_ns_t)in_stack_fffffffffffff838.bits);
        break;
      case (LogicalType *)0xb:
        local_1e1 = DecimalType::GetWidth((LogicalType *)in_stack_fffffffffffff800);
        type_00 = (PhysicalType)((ulong)in_stack_fffffffffffff8e8 >> 0x38);
        uVar11 = (undefined2)(in_stack_fffffffffffff838.bits >> 0x30);
        local_1e2 = DecimalType::GetScale((LogicalType *)in_stack_fffffffffffff800);
        PVar3 = LogicalType::InternalType(local_a0);
        if (PVar3 == INT128) {
          local_1f8 = *(undefined8 *)(local_90 + local_28 * 0x10);
          local_1f0 = *(undefined8 *)(local_90 + local_28 * 0x10 + 8);
          value_03.upper = in_stack_fffffffffffff848;
          value_03.lower = (uint64_t)in_stack_fffffffffffff840;
          Value::DECIMAL(value_03,(uint8_t)((ushort)uVar11 >> 8),(uint8_t)uVar11);
        }
        else if (PVar3 == INT16) {
          Value::DECIMAL((int16_t)((ulong)in_stack_fffffffffffff7f8 >> 0x30),
                         (uint8_t)((ulong)in_stack_fffffffffffff7f8 >> 0x28),
                         (uint8_t)((ulong)in_stack_fffffffffffff7f8 >> 0x20));
        }
        else if (PVar3 == INT32) {
          Value::DECIMAL((int32_t)((ulong)in_stack_fffffffffffff7f8 >> 0x20),
                         (uint8_t)((ulong)in_stack_fffffffffffff7f8 >> 0x18),
                         (uint8_t)((ulong)in_stack_fffffffffffff7f8 >> 0x10));
        }
        else {
          if (PVar3 != INT64) {
            local_241 = 1;
            uVar6 = __cxa_allocate_exception(0x10);
            paVar10 = &local_219;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_218,
                       "Physical type \'%s\' has a width bigger than 38, which is not supported",
                       paVar10);
            LogicalType::InternalType(local_a0);
            TypeIdToString_abi_cxx11_(type_00);
            InternalException::InternalException<std::__cxx11::string>
                      ((InternalException *)in_stack_fffffffffffff870,in_stack_fffffffffffff868,
                       in_stack_fffffffffffff860);
            local_241 = 0;
            __cxa_throw(uVar6,&InternalException::typeinfo,InternalException::~InternalException);
          }
          Value::DECIMAL((int64_t)in_stack_fffffffffffff878,
                         (uint8_t)((ulong)in_stack_fffffffffffff870 >> 0x38),
                         (uint8_t)((ulong)in_stack_fffffffffffff870 >> 0x30));
        }
        break;
      case (LogicalType *)0xc:
        Value::FLOAT((float)value_04.days);
        break;
      case (LogicalType *)0xd:
        Value::DOUBLE((double)in_stack_fffffffffffff838.bits);
        break;
      default:
        msg = (string *)__cxa_allocate_exception(0x10);
        paVar10 = &local_681;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_680,"Unimplemented type for value access",paVar10);
        InternalException::InternalException((InternalException *)paVar10,msg);
        __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
      case (LogicalType *)0xf:
        local_298 = *(undefined8 *)(local_90 + local_28 * 0x10);
        uStack_290 = *(undefined8 *)(local_90 + local_28 * 0x10 + 8);
        string_t::GetString_abi_cxx11_((string_t *)in_stack_fffffffffffff838.bits);
        Value::Value(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
        ::std::__cxx11::string::~string(local_2b8);
        break;
      case (LogicalType *)0x10:
        local_2c8._0_8_ = *(undefined8 *)(local_90 + local_28 * 0x10);
        local_2c8.pointer.ptr = (char *)*(undefined8 *)(local_90 + local_28 * 0x10 + 8);
        pcVar7 = string_t::GetData((string_t *)in_stack_fffffffffffff800);
        pdVar8 = const_data_ptr_cast<char>(pcVar7);
        string_t::GetSize((string_t *)&local_2c8.pointer);
        Value::BLOB(pdVar8,(idx_t)in_stack_fffffffffffff890);
        break;
      case (LogicalType *)0x11:
        local_280 = *(undefined8 *)(local_90 + local_28 * 0x10);
        local_278 = *(undefined8 *)(local_90 + local_28 * 0x10 + 8);
        interval.micros = (int64_t)in_stack_fffffffffffff808;
        interval._0_8_ = in_stack_fffffffffffff800;
        Value::INTERVAL(interval);
        break;
      case (LogicalType *)0x12:
        Value::UTINYINT(bVar1);
        break;
      case (LogicalType *)0x13:
        Value::USMALLINT(value_05);
        break;
      case (LogicalType *)0x14:
        Value::UINTEGER(value_04.days);
        break;
      case (LogicalType *)0x15:
        Value::UBIGINT(in_stack_fffffffffffff838.bits);
        break;
      case (LogicalType *)0x16:
        local_1b0 = *(undefined8 *)(local_90 + local_28 * 8);
        Value::TIMESTAMPTZ((timestamp_tz_t)in_stack_fffffffffffff838.bits);
        break;
      case (LogicalType *)0x18:
        local_188 = *(undefined8 *)(local_90 + local_28 * 8);
        Value::TIMETZ(in_stack_fffffffffffff838);
        break;
      case (LogicalType *)0x1a:
        local_2f8._0_8_ = *(undefined8 *)(local_90 + local_28 * 0x10);
        local_2f8.pointer.ptr = (char *)*(undefined8 *)(local_90 + local_28 * 0x10 + 8);
        pcVar7 = string_t::GetData((string_t *)in_stack_fffffffffffff800);
        const_data_ptr_cast<char>(pcVar7);
        string_t::GetSize((string_t *)&local_2f8.pointer);
        Value::BIT(&in_stack_fffffffffffff898->id_,(idx_t)in_stack_fffffffffffff890);
        break;
      case (LogicalType *)0x1d:
        local_2d8._0_8_ = *(undefined8 *)(local_90 + local_28 * 0x10);
        local_2d8.pointer.ptr = (char *)*(undefined8 *)(local_90 + local_28 * 0x10 + 8);
        pcVar7 = string_t::GetData((string_t *)in_stack_fffffffffffff800);
        const_data_ptr_cast<char>(pcVar7);
        string_t::GetSize((string_t *)&local_2d8.pointer);
        Value::VARINT((const_data_ptr_t)
                      CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                      in_stack_fffffffffffff850);
        break;
      case (LogicalType *)0x27:
        local_1d0 = *(undefined8 *)(local_90 + local_28 * 0x10);
        local_1c8 = *(undefined8 *)(local_90 + local_28 * 0x10 + 8);
        value_01.upper = in_stack_fffffffffffff848;
        value_01.lower = (uint64_t)in_stack_fffffffffffff840;
        Value::UHUGEINT(value_01);
        break;
      case (LogicalType *)0x28:
        local_1c0 = *(undefined8 *)(local_90 + local_28 * 0x10);
        local_1b8 = *(undefined8 *)(local_90 + local_28 * 0x10 + 8);
        value_00.upper = in_stack_fffffffffffff848;
        value_00.lower = (uint64_t)in_stack_fffffffffffff840;
        Value::HUGEINT(value_00);
        break;
      case (LogicalType *)0x29:
        Value::POINTER(in_stack_fffffffffffff838.bits);
        break;
      case (LogicalType *)0x2c:
        local_1e0 = *(undefined8 *)(local_90 + local_28 * 0x10);
        local_1d8 = *(undefined8 *)(local_90 + local_28 * 0x10 + 8);
        value_02.upper = in_stack_fffffffffffff848;
        value_02.lower = (uint64_t)in_stack_fffffffffffff840;
        Value::UUID(value_02);
        break;
      case (LogicalType *)0x5a:
        local_460 = &StructVector::GetEntries((Vector *)0x3df5d8)->
                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
        ;
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
        ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                  *)0x3df5ed);
        local_480 = 0;
        while (uVar12 = local_480,
              sVar9 = ::std::
                      vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                      ::size(local_460), uVar12 < sVar9) {
          local_488 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      ::operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                                    *)in_stack_fffffffffffff800,(size_type)in_stack_fffffffffffff7f8
                                  );
          StructType::GetChildName_abi_cxx11_
                    ((LogicalType *)in_stack_fffffffffffff800,(idx_t)in_stack_fffffffffffff7f8);
          unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                    ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                     in_stack_fffffffffffff800);
          GetValue(in_stack_fffffffffffff808,(idx_t)in_stack_fffffffffffff800);
          ::std::make_pair<std::__cxx11::string_const&,duckdb::Value>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff808,(Value *)in_stack_fffffffffffff800);
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                       *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
          ::std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
                   *)in_stack_fffffffffffff800);
          Value::~Value((Value *)in_stack_fffffffffffff800);
          local_480 = local_480 + 1;
        }
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
        ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                  *)in_stack_fffffffffffff800,
                 (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                  *)in_stack_fffffffffffff7f8);
        Value::STRUCT(in_stack_fffffffffffff908);
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                   *)0x3df799);
        local_14c = 1;
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                   *)0x3df7b1);
        break;
      case (LogicalType *)0x5b:
        local_550 = *(ulong *)(local_90 + local_28 * 0x10);
        local_548 = *(ulong *)((long)(local_90 + local_28 * 0x10) + 8);
        local_558 = ListVector::GetEntry((Vector *)0x3df824);
        vector<duckdb::Value,_true>::vector((vector<duckdb::Value,_true> *)0x3df839);
        for (local_578 = local_550; local_578 < local_550 + local_548; local_578 = local_578 + 1) {
          GetValue(in_stack_fffffffffffff808,(idx_t)in_stack_fffffffffffff800);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                     in_stack_fffffffffffff800,(value_type *)in_stack_fffffffffffff7f8);
          Value::~Value((Value *)in_stack_fffffffffffff800);
        }
        ListType::GetChildType((LogicalType *)in_stack_fffffffffffff800);
        vector<duckdb::Value,_true>::vector
                  ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff800,
                   (vector<duckdb::Value,_true> *)in_stack_fffffffffffff7f8);
        Value::LIST(pLVar5,(vector<duckdb::Value,_true> *)
                           CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
        vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x3df956);
        local_14c = 1;
        vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x3df96e);
        break;
      case (LogicalType *)0x5c:
        local_308 = *(ulong *)(local_90 + local_28 * 0x10);
        local_300 = *(ulong *)((long)(local_90 + local_28 * 0x10) + 8);
        local_310 = ListVector::GetEntry((Vector *)0x3df255);
        vector<duckdb::Value,_true>::vector((vector<duckdb::Value,_true> *)0x3df26a);
        for (local_330 = local_308; local_330 < local_308 + local_300; local_330 = local_330 + 1) {
          GetValue(in_stack_fffffffffffff808,(idx_t)in_stack_fffffffffffff800);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                     in_stack_fffffffffffff800,(value_type *)in_stack_fffffffffffff7f8);
          Value::~Value((Value *)in_stack_fffffffffffff800);
        }
        ListType::GetChildType((LogicalType *)in_stack_fffffffffffff800);
        vector<duckdb::Value,_true>::vector
                  ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff800,
                   (vector<duckdb::Value,_true> *)in_stack_fffffffffffff7f8);
        Value::MAP(in_stack_fffffffffffff948,in_stack_fffffffffffff940);
        vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x3df387);
        local_14c = 1;
        vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x3df39f);
        break;
      case (LogicalType *)0x5e:
        PVar3 = LogicalType::InternalType(local_a0);
        if (PVar3 == UINT8) {
          Value::ENUM((uint64_t)in_stack_fffffffffffff888,&in_stack_fffffffffffff880->type_);
        }
        else if (PVar3 == UINT16) {
          Value::ENUM((uint64_t)in_stack_fffffffffffff888,&in_stack_fffffffffffff880->type_);
        }
        else {
          if (PVar3 != UINT32) {
            local_26a = 1;
            uVar6 = __cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_268,"ENUM can only have unsigned integers as physical types",&local_269
                      );
            InternalException::InternalException
                      ((InternalException *)in_stack_fffffffffffff800,
                       (string *)in_stack_fffffffffffff7f8);
            local_26a = 0;
            __cxa_throw(uVar6,&InternalException::typeinfo,InternalException::~InternalException);
          }
          Value::ENUM((uint64_t)in_stack_fffffffffffff888,&in_stack_fffffffffffff880->type_);
        }
        break;
      case (LogicalType *)0x5f:
        local_2e8._0_8_ = *(undefined8 *)(local_90 + local_28 * 0x10);
        local_2e8.pointer.ptr = (char *)*(undefined8 *)(local_90 + local_28 * 0x10 + 8);
        GetType(local_20);
        pcVar7 = string_t::GetData((string_t *)in_stack_fffffffffffff800);
        pdVar8 = const_data_ptr_cast<char>(pcVar7);
        string_t::GetSize((string_t *)&local_2e8.pointer);
        Value::AGGREGATE_STATE(in_stack_fffffffffffff898,in_stack_fffffffffffff890,(idx_t)pdVar8);
        break;
      case (LogicalType *)0x61:
        bVar1 = UnionVector::TryGetTag
                          (in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                           in_stack_fffffffffffff818);
        if (bVar1) {
          UnionVector::GetMember(in_stack_fffffffffffff800,(idx_t)in_stack_fffffffffffff7f8);
          GetValue(in_stack_fffffffffffff808,(idx_t)in_stack_fffffffffffff800);
          UnionType::CopyMemberTypes_abi_cxx11_((LogicalType *)in_stack_fffffffffffff838.bits);
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
          ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                    *)in_stack_fffffffffffff800,
                   (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                    *)in_stack_fffffffffffff7f8);
          Value::Value((Value *)in_stack_fffffffffffff800,(Value *)in_stack_fffffffffffff7f8);
          Value::UNION(in_stack_fffffffffffff928,tag_00,in_stack_fffffffffffff918);
          Value::~Value((Value *)in_stack_fffffffffffff800);
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                     *)0x3df4ba);
          local_14c = 1;
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                     *)0x3df4d2);
          Value::~Value((Value *)in_stack_fffffffffffff800);
        }
        else {
          GetType(local_20);
          LogicalType::LogicalType
                    ((LogicalType *)in_stack_fffffffffffff800,
                     (LogicalType *)in_stack_fffffffffffff7f8);
          Value::Value((Value *)in_stack_fffffffffffff810,(LogicalType *)in_stack_fffffffffffff808);
          LogicalType::~LogicalType((LogicalType *)0x3df5a0);
        }
        break;
      case (LogicalType *)0x62:
        local_5d8 = ArrayType::GetSize((LogicalType *)in_stack_fffffffffffff800);
        local_5e0 = local_28 * local_5d8;
        local_5e8 = ArrayVector::GetEntry((Vector *)0x3df9e1);
        vector<duckdb::Value,_true>::vector((vector<duckdb::Value,_true> *)0x3df9f6);
        for (local_608 = local_5e0; local_608 < local_5e0 + local_5d8; local_608 = local_608 + 1) {
          GetValue(in_stack_fffffffffffff808,(idx_t)in_stack_fffffffffffff800);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                     in_stack_fffffffffffff800,(value_type *)in_stack_fffffffffffff7f8);
          Value::~Value((Value *)in_stack_fffffffffffff800);
        }
        ArrayType::GetChildType((LogicalType *)in_stack_fffffffffffff800);
        vector<duckdb::Value,_true>::vector
                  ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff800,
                   (vector<duckdb::Value,_true> *)in_stack_fffffffffffff7f8);
        Value::ARRAY(in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
        vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x3dfb13);
        local_14c = 1;
        vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x3dfb2b);
      }
    }
  }
  else {
    GetType(local_20);
    LogicalType::LogicalType
              ((LogicalType *)in_stack_fffffffffffff800,(LogicalType *)in_stack_fffffffffffff7f8);
    Value::Value((Value *)in_stack_fffffffffffff810,(LogicalType *)in_stack_fffffffffffff808);
    LogicalType::~LogicalType((LogicalType *)0x3de218);
  }
  return in_RDI;
}

Assistant:

Value Vector::GetValueInternal(const Vector &v_p, idx_t index_p) {
	const Vector *vector = &v_p;
	idx_t index = index_p;
	bool finished = false;
	while (!finished) {
		switch (vector->GetVectorType()) {
		case VectorType::CONSTANT_VECTOR:
			index = 0;
			finished = true;
			break;
		case VectorType::FLAT_VECTOR:
			finished = true;
			break;
		case VectorType::FSST_VECTOR:
			finished = true;
			break;
		// dictionary: apply dictionary and forward to child
		case VectorType::DICTIONARY_VECTOR: {
			auto &sel_vector = DictionaryVector::SelVector(*vector);
			auto &child = DictionaryVector::Child(*vector);
			vector = &child;
			index = sel_vector.get_index(index);
			break;
		}
		case VectorType::SEQUENCE_VECTOR: {
			int64_t start, increment;
			SequenceVector::GetSequence(*vector, start, increment);
			return Value::Numeric(vector->GetType(), start + increment * NumericCast<int64_t>(index));
		}
		default:
			throw InternalException("Unimplemented vector type for Vector::GetValue");
		}
	}
	auto data = vector->data;
	auto &validity = vector->validity;
	auto &type = vector->GetType();

	if (!validity.RowIsValid(index)) {
		return Value(vector->GetType());
	}

	if (vector->GetVectorType() == VectorType::FSST_VECTOR) {
		if (vector->GetType().InternalType() != PhysicalType::VARCHAR) {
			throw InternalException("FSST Vector with non-string datatype found!");
		}
		auto str_compressed = reinterpret_cast<string_t *>(data)[index];
		auto decoder = FSSTVector::GetDecoder(*vector);
		auto &decompress_buffer = FSSTVector::GetDecompressBuffer(*vector);
		auto string_val = FSSTPrimitives::DecompressValue(decoder, str_compressed.GetData(), str_compressed.GetSize(),
		                                                  decompress_buffer);
		switch (vector->GetType().id()) {
		case LogicalTypeId::VARCHAR:
			return Value(std::move(string_val));
		case LogicalTypeId::BLOB:
			return Value::BLOB_RAW(string_val);
		default:
			throw InternalException("Unsupported vector type for FSST vector");
		}
	}

	switch (vector->GetType().id()) {
	case LogicalTypeId::BOOLEAN:
		return Value::BOOLEAN(reinterpret_cast<bool *>(data)[index]);
	case LogicalTypeId::TINYINT:
		return Value::TINYINT(reinterpret_cast<int8_t *>(data)[index]);
	case LogicalTypeId::SMALLINT:
		return Value::SMALLINT(reinterpret_cast<int16_t *>(data)[index]);
	case LogicalTypeId::INTEGER:
		return Value::INTEGER(reinterpret_cast<int32_t *>(data)[index]);
	case LogicalTypeId::DATE:
		return Value::DATE(reinterpret_cast<date_t *>(data)[index]);
	case LogicalTypeId::TIME:
		return Value::TIME(reinterpret_cast<dtime_t *>(data)[index]);
	case LogicalTypeId::TIME_TZ:
		return Value::TIMETZ(reinterpret_cast<dtime_tz_t *>(data)[index]);
	case LogicalTypeId::BIGINT:
		return Value::BIGINT(reinterpret_cast<int64_t *>(data)[index]);
	case LogicalTypeId::UTINYINT:
		return Value::UTINYINT(reinterpret_cast<uint8_t *>(data)[index]);
	case LogicalTypeId::USMALLINT:
		return Value::USMALLINT(reinterpret_cast<uint16_t *>(data)[index]);
	case LogicalTypeId::UINTEGER:
		return Value::UINTEGER(reinterpret_cast<uint32_t *>(data)[index]);
	case LogicalTypeId::UBIGINT:
		return Value::UBIGINT(reinterpret_cast<uint64_t *>(data)[index]);
	case LogicalTypeId::TIMESTAMP:
		return Value::TIMESTAMP(reinterpret_cast<timestamp_t *>(data)[index]);
	case LogicalTypeId::TIMESTAMP_NS:
		return Value::TIMESTAMPNS(reinterpret_cast<timestamp_ns_t *>(data)[index]);
	case LogicalTypeId::TIMESTAMP_MS:
		return Value::TIMESTAMPMS(reinterpret_cast<timestamp_ms_t *>(data)[index]);
	case LogicalTypeId::TIMESTAMP_SEC:
		return Value::TIMESTAMPSEC(reinterpret_cast<timestamp_sec_t *>(data)[index]);
	case LogicalTypeId::TIMESTAMP_TZ:
		return Value::TIMESTAMPTZ(reinterpret_cast<timestamp_tz_t *>(data)[index]);
	case LogicalTypeId::HUGEINT:
		return Value::HUGEINT(reinterpret_cast<hugeint_t *>(data)[index]);
	case LogicalTypeId::UHUGEINT:
		return Value::UHUGEINT(reinterpret_cast<uhugeint_t *>(data)[index]);
	case LogicalTypeId::UUID:
		return Value::UUID(reinterpret_cast<hugeint_t *>(data)[index]);
	case LogicalTypeId::DECIMAL: {
		auto width = DecimalType::GetWidth(type);
		auto scale = DecimalType::GetScale(type);
		switch (type.InternalType()) {
		case PhysicalType::INT16:
			return Value::DECIMAL(reinterpret_cast<int16_t *>(data)[index], width, scale);
		case PhysicalType::INT32:
			return Value::DECIMAL(reinterpret_cast<int32_t *>(data)[index], width, scale);
		case PhysicalType::INT64:
			return Value::DECIMAL(reinterpret_cast<int64_t *>(data)[index], width, scale);
		case PhysicalType::INT128:
			return Value::DECIMAL(reinterpret_cast<hugeint_t *>(data)[index], width, scale);
		default:
			throw InternalException("Physical type '%s' has a width bigger than 38, which is not supported",
			                        TypeIdToString(type.InternalType()));
		}
	}
	case LogicalTypeId::ENUM: {
		switch (type.InternalType()) {
		case PhysicalType::UINT8:
			return Value::ENUM(reinterpret_cast<uint8_t *>(data)[index], type);
		case PhysicalType::UINT16:
			return Value::ENUM(reinterpret_cast<uint16_t *>(data)[index], type);
		case PhysicalType::UINT32:
			return Value::ENUM(reinterpret_cast<uint32_t *>(data)[index], type);
		default:
			throw InternalException("ENUM can only have unsigned integers as physical types");
		}
	}
	case LogicalTypeId::POINTER:
		return Value::POINTER(reinterpret_cast<uintptr_t *>(data)[index]);
	case LogicalTypeId::FLOAT:
		return Value::FLOAT(reinterpret_cast<float *>(data)[index]);
	case LogicalTypeId::DOUBLE:
		return Value::DOUBLE(reinterpret_cast<double *>(data)[index]);
	case LogicalTypeId::INTERVAL:
		return Value::INTERVAL(reinterpret_cast<interval_t *>(data)[index]);
	case LogicalTypeId::VARCHAR: {
		auto str = reinterpret_cast<string_t *>(data)[index];
		return Value(str.GetString());
	}
	case LogicalTypeId::BLOB: {
		auto str = reinterpret_cast<string_t *>(data)[index];
		return Value::BLOB(const_data_ptr_cast(str.GetData()), str.GetSize());
	}
	case LogicalTypeId::VARINT: {
		auto str = reinterpret_cast<string_t *>(data)[index];
		return Value::VARINT(const_data_ptr_cast(str.GetData()), str.GetSize());
	}
	case LogicalTypeId::AGGREGATE_STATE: {
		auto str = reinterpret_cast<string_t *>(data)[index];
		return Value::AGGREGATE_STATE(vector->GetType(), const_data_ptr_cast(str.GetData()), str.GetSize());
	}
	case LogicalTypeId::BIT: {
		auto str = reinterpret_cast<string_t *>(data)[index];
		return Value::BIT(const_data_ptr_cast(str.GetData()), str.GetSize());
	}
	case LogicalTypeId::MAP: {
		auto offlen = reinterpret_cast<list_entry_t *>(data)[index];
		auto &child_vec = ListVector::GetEntry(*vector);
		duckdb::vector<Value> children;
		for (idx_t i = offlen.offset; i < offlen.offset + offlen.length; i++) {
			children.push_back(child_vec.GetValue(i));
		}
		return Value::MAP(ListType::GetChildType(type), std::move(children));
	}
	case LogicalTypeId::UNION: {
		// Remember to pass the original index_p here so we dont slice twice when looking up the tag
		// in case this is a dictionary vector
		union_tag_t tag;
		if (UnionVector::TryGetTag(*vector, index_p, tag)) {
			auto value = UnionVector::GetMember(*vector, tag).GetValue(index_p);
			auto members = UnionType::CopyMemberTypes(type);
			return Value::UNION(members, tag, std::move(value));
		} else {
			return Value(vector->GetType());
		}
	}
	case LogicalTypeId::STRUCT: {
		// we can derive the value schema from the vector schema
		auto &child_entries = StructVector::GetEntries(*vector);
		child_list_t<Value> children;
		for (idx_t child_idx = 0; child_idx < child_entries.size(); child_idx++) {
			auto &struct_child = child_entries[child_idx];
			children.push_back(make_pair(StructType::GetChildName(type, child_idx), struct_child->GetValue(index_p)));
		}
		return Value::STRUCT(std::move(children));
	}
	case LogicalTypeId::LIST: {
		auto offlen = reinterpret_cast<list_entry_t *>(data)[index];
		auto &child_vec = ListVector::GetEntry(*vector);
		duckdb::vector<Value> children;
		for (idx_t i = offlen.offset; i < offlen.offset + offlen.length; i++) {
			children.push_back(child_vec.GetValue(i));
		}
		return Value::LIST(ListType::GetChildType(type), std::move(children));
	}
	case LogicalTypeId::ARRAY: {
		auto stride = ArrayType::GetSize(type);
		auto offset = index * stride;
		auto &child_vec = ArrayVector::GetEntry(*vector);
		duckdb::vector<Value> children;
		for (idx_t i = offset; i < offset + stride; i++) {
			children.push_back(child_vec.GetValue(i));
		}
		return Value::ARRAY(ArrayType::GetChildType(type), std::move(children));
	}
	default:
		throw InternalException("Unimplemented type for value access");
	}
}